

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O2

StackFrame * __thiscall
moira::Moira::makeFrame<0ull>
          (StackFrame *__return_storage_ptr__,Moira *this,u32 addr,u32 pc,u16 sr,u16 ird)

{
  byte bVar1;
  
  bVar1 = readFC(this);
  __return_storage_ptr__->code = (ushort)bVar1 | ird & 0xffe0 | 0x10;
  __return_storage_ptr__->addr = addr;
  __return_storage_ptr__->ird = ird;
  __return_storage_ptr__->sr = sr;
  __return_storage_ptr__->pc = pc;
  bVar1 = readFC(this);
  __return_storage_ptr__->fc = (ushort)bVar1;
  __return_storage_ptr__->ssw = (ushort)bVar1;
  return __return_storage_ptr__;
}

Assistant:

StackFrame
Moira::makeFrame(u32 addr, u32 pc, u16 sr, u16 ird)
{
    StackFrame frame;
    u16 read = 0x10;

    // Prepare
    if constexpr (F & AE_WRITE) read = 0;
    if constexpr (F & AE_PROG) setFC(FC::USER_PROG);
    if constexpr (F & AE_DATA) setFC(FC::USER_DATA);

    // Create
    frame.code = (ird & 0xFFE0) | (u16)readFC() | read;
    frame.addr = addr;
    frame.ird = ird;
    frame.sr = sr;
    frame.pc = pc;
    frame.fc = readFC();
    frame.ssw = frame.fc;

    // Adjust
    if constexpr (F & AE_INC_PC) frame.pc += 2;
    if constexpr (F & AE_DEC_PC) frame.pc -= 2;
    if constexpr (F & AE_INC_A) frame.addr += 2;
    if constexpr (F & AE_DEC_A) frame.addr -= 2;
    if constexpr (F & AE_SET_CB3) frame.code |= (1 << 3);
    if constexpr (F & AE_SET_RW) frame.ssw |= (1 << 8);
    if constexpr (F & AE_SET_DF) frame.ssw |= (1 << 12);
    if constexpr (F & AE_SET_IF) frame.ssw |= (1 << 13);

    return frame;
}